

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

char * build_ustar_entry_name(char *dest,char *src,size_t src_length,char *insert)

{
  char *pcVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  bool bVar5;
  long local_80;
  size_t insert_length;
  size_t suffix_length;
  char *pcStack_68;
  int need_slash;
  char *p;
  char *filename_end;
  char *filename;
  char *suffix_end;
  char *suffix;
  char *prefix_end;
  char *prefix;
  char *insert_local;
  size_t src_length_local;
  char *src_local;
  char *dest_local;
  
  bVar2 = false;
  insert_length = 99;
  if (insert == (char *)0x0) {
    local_80 = 0;
  }
  else {
    sVar3 = strlen(insert);
    local_80 = sVar3 + 2;
  }
  if ((src_length < 100) && (insert == (char *)0x0)) {
    strncpy(dest,src,src_length);
    dest[src_length] = '\0';
  }
  else {
    p = src + src_length;
    while( true ) {
      for (; (src < p && (p[-1] == '/')); p = p + -1) {
        bVar2 = true;
      }
      if (((p <= src + 1) || (p[-1] != '.')) || (p[-2] != '/')) break;
      p = p + -2;
      bVar2 = true;
    }
    pcVar4 = p;
    if (bVar2) {
      insert_length = 0x62;
    }
    do {
      pcVar1 = pcVar4;
      filename_end = pcVar1 + -1;
      bVar5 = false;
      if (src < filename_end) {
        bVar5 = *filename_end != '/';
      }
      pcVar4 = filename_end;
    } while (bVar5);
    if ((*filename_end == '/') && (filename_end < p + -1)) {
      filename_end = pcVar1;
    }
    local_80 = insert_length - local_80;
    if (filename_end + local_80 < p) {
      p = filename_end + local_80;
    }
    suffix = src + 0x9b;
    if (filename_end < suffix) {
      suffix = filename_end;
    }
    while( true ) {
      bVar5 = false;
      if (src < suffix) {
        bVar5 = *suffix != '/';
      }
      if (!bVar5) break;
      suffix = suffix + -1;
    }
    if ((suffix < filename_end) && (*suffix == '/')) {
      suffix = suffix + 1;
    }
    filename = suffix + (local_80 - ((long)p - (long)filename_end));
    if (filename_end < filename) {
      filename = filename_end;
    }
    if (filename < suffix) {
      filename = suffix;
    }
    while( true ) {
      bVar5 = false;
      if (suffix < filename) {
        bVar5 = *filename != '/';
      }
      if (!bVar5) break;
      filename = filename + -1;
    }
    if ((filename < filename_end) && (*filename == '/')) {
      filename = filename + 1;
    }
    pcStack_68 = dest;
    if (src < suffix) {
      strncpy(dest,src,(long)suffix - (long)src);
      pcStack_68 = dest + ((long)suffix - (long)src);
    }
    if (suffix < filename) {
      strncpy(pcStack_68,suffix,(long)filename - (long)suffix);
      pcStack_68 = pcStack_68 + ((long)filename - (long)suffix);
    }
    if (insert != (char *)0x0) {
      strcpy(pcStack_68,insert);
      sVar3 = strlen(insert);
      pcVar4 = pcStack_68 + sVar3;
      pcStack_68 = pcVar4 + 1;
      *pcVar4 = '/';
    }
    strncpy(pcStack_68,filename_end,(long)p - (long)filename_end);
    pcVar4 = pcStack_68 + ((long)p - (long)filename_end);
    pcStack_68 = pcVar4;
    if (bVar2) {
      pcStack_68 = pcVar4 + 1;
      *pcVar4 = '/';
    }
    *pcStack_68 = '\0';
  }
  return dest;
}

Assistant:

static char *
build_ustar_entry_name(char *dest, const char *src, size_t src_length,
    const char *insert)
{
	const char *prefix, *prefix_end;
	const char *suffix, *suffix_end;
	const char *filename, *filename_end;
	char *p;
	int need_slash = 0; /* Was there a trailing slash? */
	size_t suffix_length = 99;
	size_t insert_length;

	/* Length of additional dir element to be added. */
	if (insert == NULL)
		insert_length = 0;
	else
		/* +2 here allows for '/' before and after the insert. */
		insert_length = strlen(insert) + 2;

	/* Step 0: Quick bailout in a common case. */
	if (src_length < 100 && insert == NULL) {
		strncpy(dest, src, src_length);
		dest[src_length] = '\0';
		return (dest);
	}

	/* Step 1: Locate filename and enforce the length restriction. */
	filename_end = src + src_length;
	/* Remove trailing '/' chars and '/.' pairs. */
	for (;;) {
		if (filename_end > src && filename_end[-1] == '/') {
			filename_end --;
			need_slash = 1; /* Remember to restore trailing '/'. */
			continue;
		}
		if (filename_end > src + 1 && filename_end[-1] == '.'
		    && filename_end[-2] == '/') {
			filename_end -= 2;
			need_slash = 1; /* "foo/." will become "foo/" */
			continue;
		}
		break;
	}
	if (need_slash)
		suffix_length--;
	/* Find start of filename. */
	filename = filename_end - 1;
	while ((filename > src) && (*filename != '/'))
		filename --;
	if ((*filename == '/') && (filename < filename_end - 1))
		filename ++;
	/* Adjust filename_end so that filename + insert fits in 99 chars. */
	suffix_length -= insert_length;
	if (filename_end > filename + suffix_length)
		filename_end = filename + suffix_length;
	/* Calculate max size for "suffix" section (#3 above). */
	suffix_length -= filename_end - filename;

	/* Step 2: Locate the "prefix" section of the dirname, including
	 * trailing '/'. */
	prefix = src;
	prefix_end = prefix + 155;
	if (prefix_end > filename)
		prefix_end = filename;
	while (prefix_end > prefix && *prefix_end != '/')
		prefix_end--;
	if ((prefix_end < filename) && (*prefix_end == '/'))
		prefix_end++;

	/* Step 3: Locate the "suffix" section of the dirname,
	 * including trailing '/'. */
	suffix = prefix_end;
	suffix_end = suffix + suffix_length; /* Enforce limit. */
	if (suffix_end > filename)
		suffix_end = filename;
	if (suffix_end < suffix)
		suffix_end = suffix;
	while (suffix_end > suffix && *suffix_end != '/')
		suffix_end--;
	if ((suffix_end < filename) && (*suffix_end == '/'))
		suffix_end++;

	/* Step 4: Build the new name. */
	/* The OpenBSD strlcpy function is safer, but less portable. */
	/* Rather than maintain two versions, just use the strncpy version. */
	p = dest;
	if (prefix_end > prefix) {
		strncpy(p, prefix, prefix_end - prefix);
		p += prefix_end - prefix;
	}
	if (suffix_end > suffix) {
		strncpy(p, suffix, suffix_end - suffix);
		p += suffix_end - suffix;
	}
	if (insert != NULL) {
		/* Note: assume insert does not have leading or trailing '/' */
		strcpy(p, insert);
		p += strlen(insert);
		*p++ = '/';
	}
	strncpy(p, filename, filename_end - filename);
	p += filename_end - filename;
	if (need_slash)
		*p++ = '/';
	*p = '\0';

	return (dest);
}